

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::LookupSymbolByAddress
          (ElfMemImage *this,void *address,SymbolInfo *info_out)

{
  byte bVar1;
  uint32_t uVar2;
  ElfMemImage *__range2;
  SymbolIterator __begin2;
  SymbolIterator local_60;
  
  local_60.index_ = 0;
  local_60.image_ = this;
  SymbolIterator::Update(&local_60,0);
  uVar2 = this->num_syms_;
  if (((ElfMemImage *)local_60.image_ != this) || (local_60.index_ != uVar2)) {
    do {
      if ((local_60.info_.address <= address) &&
         (address < (void *)((long)local_60.info_.address + (local_60.info_.symbol)->st_size))) {
        if (info_out == (SymbolInfo *)0x0) {
          return true;
        }
        bVar1 = (local_60.info_.symbol)->st_info;
        info_out->address = local_60.info_.address;
        info_out->symbol = local_60.info_.symbol;
        info_out->name = local_60.info_.name;
        info_out->version = local_60.info_.version;
        if ((bVar1 & 0xf0) == 0x10) {
          return true;
        }
      }
      SymbolIterator::Update(&local_60,1);
    } while (((ElfMemImage *)local_60.image_ != this) || (local_60.index_ != uVar2));
  }
  return false;
}

Assistant:

bool ElfMemImage::LookupSymbolByAddress(const void *address,
                                        SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    const char *const symbol_start =
        reinterpret_cast<const char *>(info.address);
    const char *const symbol_end = symbol_start + info.symbol->st_size;
    if (symbol_start <= address && address < symbol_end) {
      if (info_out) {
        // Client wants to know details for that symbol (the usual case).
        if (ElfBind(info.symbol) == STB_GLOBAL) {
          // Strong symbol; just return it.
          *info_out = info;
          return true;
        } else {
          // Weak or local. Record it, but keep looking for a strong one.
          *info_out = info;
        }
      } else {
        // Client only cares if there is an overlapping symbol.
        return true;
      }
    }
  }
  return false;
}